

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O2

String * __thiscall kj::Url::toString(String *__return_storage_ptr__,Url *this,Context context)

{
  String *params_1;
  char *pcVar1;
  uchar *puVar2;
  RemoveConst<kj::Url::QueryParam> *pRVar3;
  bool bVar4;
  undefined1 uVar5;
  undefined7 extraout_var;
  String *in_RCX;
  String *params;
  String *params_00;
  char *pcVar6;
  String *params_01;
  uchar *puVar7;
  String *params_02;
  kj *pkVar8;
  String *params_03;
  String *params_04;
  kj *pkVar9;
  char *pcVar10;
  uchar *puVar11;
  kj *pkVar12;
  kj *pkVar13;
  ArrayPtr<const_char> text;
  ArrayPtr<const_unsigned_char> bytes;
  ArrayPtr<const_unsigned_char> bytes_00;
  ArrayPtr<const_unsigned_char> bytes_01;
  ArrayPtr<const_unsigned_char> bytes_02;
  ArrayPtr<const_unsigned_char> bytes_03;
  ArrayPtr<const_unsigned_char> bytes_04;
  bool _kjCondition;
  Fault f_1;
  Vector<char> chars;
  Fault f;
  StringPtr local_58;
  Array<char> local_48;
  
  chars.builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<char>(0x80);
  chars.builder.endPtr = chars.builder.ptr + 0x80;
  chars.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  chars.builder.pos = chars.builder.ptr;
  if (context != HTTP_REQUEST) {
    Vector<char>::addAll<kj::String_const&>(&chars,&this->scheme);
    f_1.exception = (Exception *)anon_var_dwarf_66d021;
    Vector<char>::addAll<kj::StringPtr>(&chars,(StringPtr *)&f_1);
    if ((context == REMOTE_HREF) && ((this->userInfo).ptr.isSet == true)) {
      if ((this->options).percentDecode == true) {
        pkVar13 = (kj *)(this->userInfo).ptr.field_1.value.username.content.size_;
        pkVar12 = pkVar13;
        if (pkVar13 != (kj *)0x0) {
          pkVar12 = (kj *)(this->userInfo).ptr.field_1.value.username.content.ptr;
        }
        pkVar9 = (kj *)0x0;
        if (pkVar13 != (kj *)0x0) {
          pkVar9 = pkVar13 + -1;
        }
        bytes_00.size_ = (size_t)in_RCX;
        bytes_00.ptr = (uchar *)pkVar9;
        encodeUriUserInfo((String *)&f_1,pkVar12,bytes_00);
      }
      else {
        str<kj::String_const&>((String *)&f_1,(kj *)&(this->userInfo).ptr.field_1.value,params);
      }
      Vector<char>::addAll<kj::String>(&chars,(String *)&f_1);
      Array<char>::~Array((Array<char> *)&f_1);
      if ((this->userInfo).ptr.field_1.value.password.ptr.isSet == true) {
        f_1.exception._0_1_ = 0x3a;
        Vector<char>::add<char>(&chars,(char *)&f_1);
        if ((this->options).percentDecode == true) {
          pkVar13 = *(kj **)((long)&(this->userInfo).ptr.field_1 + 0x28);
          pkVar12 = pkVar13;
          if (pkVar13 != (kj *)0x0) {
            pkVar12 = *(kj **)((long)&(this->userInfo).ptr.field_1 + 0x20);
          }
          pkVar9 = (kj *)0x0;
          if (pkVar13 != (kj *)0x0) {
            pkVar9 = pkVar13 + -1;
          }
          bytes_01.size_ = (size_t)in_RCX;
          bytes_01.ptr = (uchar *)pkVar9;
          encodeUriUserInfo((String *)&f_1,pkVar12,bytes_01);
        }
        else {
          str<kj::String_const&>
                    ((String *)&f_1,
                     (kj *)&(this->userInfo).ptr.field_1.value.password.ptr.field_1.value,params_00)
          ;
        }
        Vector<char>::addAll<kj::String>(&chars,(String *)&f_1);
        Array<char>::~Array((Array<char> *)&f_1);
      }
      f_1.exception._0_1_ = 0x40;
      Vector<char>::add<char>(&chars,(char *)&f_1);
    }
    pcVar1 = (char *)(this->host).content.size_;
    pcVar10 = pcVar1;
    if (pcVar1 != (char *)0x0) {
      pcVar10 = (this->host).content.ptr;
    }
    pcVar6 = (char *)0x0;
    if (pcVar1 != (char *)0x0) {
      pcVar6 = pcVar1 + -1;
    }
    text.size_ = (size_t)pcVar6;
    text.ptr = pcVar10;
    bVar4 = kj::parse::CharGroup_::containsAll((CharGroup_ *)(anonymous_namespace)::HOST_CHARS,text)
    ;
    params_1 = &this->host;
    if (bVar4) {
      Vector<char>::addAll<kj::String_const&>(&chars,params_1);
    }
    else {
      in_RCX = params_1;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],kj::String_const&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
                 ,0x1c5,FAILED,(char *)0x0,"\"invalid hostname when stringifying URL\", host",
                 (char (*) [39])"invalid hostname when stringifying URL",params_1);
      f_1.exception = (Exception *)anon_var_dwarf_66d066;
      Vector<char>::addAll<kj::StringPtr>(&chars,(StringPtr *)&f_1);
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  pkVar13 = (kj *)(this->path).builder.ptr;
  pkVar12 = (kj *)(this->path).builder.pos;
  while( true ) {
    if (pkVar13 == pkVar12) {
      if ((this->hasTrailingSlash != false) ||
         ((context == HTTP_REQUEST && ((this->path).builder.pos == (this->path).builder.ptr)))) {
        f_1.exception._0_1_ = 0x2f;
        Vector<char>::add<char>(&chars,(char *)&f_1);
      }
      pRVar3 = (this->query).builder.pos;
      uVar5 = 0x3f;
      for (pkVar13 = (kj *)&((this->query).builder.ptr)->value;
          (RemoveConst<kj::Url::QueryParam> *)(pkVar13 + -0x18) != pRVar3; pkVar13 = pkVar13 + 0x30)
      {
        f_1.exception._0_1_ = uVar5;
        Vector<char>::add<char>(&chars,(char *)&f_1);
        if ((this->options).percentDecode == true) {
          pkVar12 = *(kj **)(pkVar13 + -0x10);
          pkVar9 = pkVar12;
          if (pkVar12 != (kj *)0x0) {
            pkVar9 = *(kj **)(pkVar13 + -0x18);
          }
          pkVar8 = pkVar12 + -1;
          if (pkVar12 == (kj *)0x0) {
            pkVar8 = (kj *)0x0;
          }
          bytes_02.size_ = (size_t)in_RCX;
          bytes_02.ptr = (uchar *)pkVar8;
          encodeWwwForm((String *)&f_1,pkVar9,bytes_02);
        }
        else {
          str<kj::String_const&>((String *)&f_1,pkVar13 + -0x18,params_02);
        }
        Vector<char>::addAll<kj::String>(&chars,(String *)&f_1);
        Array<char>::~Array((Array<char> *)&f_1);
        if ((*(long *)(pkVar13 + 8) != 0) && (*(long *)pkVar13 != 0)) {
          f_1.exception._0_1_ = 0x3d;
          Vector<char>::add<char>(&chars,(char *)&f_1);
          if ((this->options).percentDecode == true) {
            pkVar12 = *(kj **)(pkVar13 + 8);
            pkVar9 = pkVar12;
            if (pkVar12 != (kj *)0x0) {
              pkVar9 = *(kj **)pkVar13;
            }
            pkVar8 = (kj *)0x0;
            if (pkVar12 != (kj *)0x0) {
              pkVar8 = pkVar12 + -1;
            }
            bytes_03.size_ = (size_t)in_RCX;
            bytes_03.ptr = (uchar *)pkVar8;
            encodeWwwForm((String *)&f_1,pkVar9,bytes_03);
          }
          else {
            str<kj::String_const&>((String *)&f_1,pkVar13,params_03);
          }
          Vector<char>::addAll<kj::String>(&chars,(String *)&f_1);
          Array<char>::~Array((Array<char> *)&f_1);
        }
        uVar5 = 0x26;
      }
      if ((context == REMOTE_HREF) && ((this->fragment).ptr.isSet == true)) {
        f_1.exception._0_1_ = 0x23;
        Vector<char>::add<char>(&chars,(char *)&f_1);
        if ((this->options).percentDecode == true) {
          pkVar13 = (kj *)(this->fragment).ptr.field_1.value.content.size_;
          pkVar12 = pkVar13;
          if (pkVar13 != (kj *)0x0) {
            pkVar12 = (kj *)(this->fragment).ptr.field_1.value.content.ptr;
          }
          pkVar9 = (kj *)0x0;
          if (pkVar13 != (kj *)0x0) {
            pkVar9 = pkVar13 + -1;
          }
          bytes_04.size_ = (size_t)in_RCX;
          bytes_04.ptr = (uchar *)pkVar9;
          encodeUriFragment((String *)&f_1,pkVar12,bytes_04);
        }
        else {
          str<kj::String_const&>((String *)&f_1,(kj *)&(this->fragment).ptr.field_1.value,params_04)
          ;
        }
        Vector<char>::addAll<kj::String>(&chars,(String *)&f_1);
        Array<char>::~Array((Array<char> *)&f_1);
      }
      f_1.exception = f_1.exception & 0xffffffffffffff00;
      Vector<char>::add<char>(&chars,(char *)&f_1);
      Vector<char>::releaseAsArray(&local_48,&chars);
      (__return_storage_ptr__->content).ptr = local_48.ptr;
      (__return_storage_ptr__->content).size_ = local_48.size_;
      (__return_storage_ptr__->content).disposer = local_48.disposer;
      local_48.ptr = (char *)0x0;
      local_48.size_ = 0;
      Array<char>::~Array(&local_48);
      ArrayBuilder<char>::dispose(&chars.builder);
      return __return_storage_ptr__;
    }
    f_1.exception = (Exception *)0x3fdd82;
    bVar4 = String::operator==((String *)pkVar13,(StringPtr *)&f_1);
    if ((bVar4) && (((this->options).allowEmpty & 1U) == 0)) break;
    f.exception = (Exception *)0x44c3f5;
    bVar4 = String::operator==((String *)pkVar13,(StringPtr *)&f);
    if (bVar4) break;
    local_58.content.ptr = "..";
    local_58.content.size_ = 3;
    bVar4 = String::operator==((String *)pkVar13,&local_58);
    in_RCX = (String *)(CONCAT71(extraout_var,bVar4) & 0xffffffff ^ 1);
    _kjCondition = SUB81(in_RCX,0);
    if (bVar4) goto LAB_00303ca6;
    f_1.exception._0_1_ = 0x2f;
    Vector<char>::add<char>(&chars,(char *)&f_1);
    if ((this->options).percentDecode == true) {
      puVar2 = *(uchar **)(pkVar13 + 8);
      puVar11 = puVar2;
      if (puVar2 != (uchar *)0x0) {
        puVar11 = *(uchar **)pkVar13;
      }
      puVar7 = puVar2 + -1;
      if (puVar2 == (uchar *)0x0) {
        puVar7 = (uchar *)0x0;
      }
      bytes.size_ = (size_t)puVar7;
      bytes.ptr = puVar11;
      encodeUriPath((String *)&f_1,bytes);
    }
    else {
      str<kj::String_const&>((String *)&f_1,pkVar13,params_01);
    }
    Vector<char>::addAll<kj::String>(&chars,(String *)&f_1);
    Array<char>::~Array((Array<char> *)&f_1);
    pkVar13 = pkVar13 + 0x18;
  }
  _kjCondition = false;
LAB_00303ca6:
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,bool&,char_const(&)[25],kj::Vector<kj::String>const&>
            (&f_1,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
             ,0x1cf,FAILED,
             "(pathPart != \"\" || options.allowEmpty) && pathPart != \".\" && pathPart != \"..\"",
             "_kjCondition,\"invalid name in URL path\", path",&_kjCondition,
             (char (*) [25])"invalid name in URL path",&this->path);
  kj::_::Debug::Fault::fatal(&f_1);
}

Assistant:

String Url::toString(Context context) const {
  Vector<char> chars(128);

  if (context != HTTP_REQUEST) {
    chars.addAll(scheme);
    chars.addAll("://"_kj);

    if (context == REMOTE_HREF) {
      KJ_IF_SOME(user, userInfo) {
        chars.addAll(options.percentDecode ? encodeUriUserInfo(user.username)
                                          : kj::str(user.username));
        KJ_IF_SOME(pass, user.password) {
          chars.add(':');
          chars.addAll(options.percentDecode ? encodeUriUserInfo(pass) : kj::str(pass));
        }
        chars.add('@');
      }
    }

    // RFC3986 specifies that hosts can contain percent-encoding escapes while suggesting that
    // they should only be used for UTF-8 sequences. However, the DNS standard specifies a
    // different way to encode Unicode into domain names and doesn't permit any characters which
    // would need to be escaped. Meanwhile, encodeUriComponent() here would incorrectly try to
    // escape colons and brackets (e.g. around ipv6 literal addresses). So, instead, we throw if
    // the host is invalid.
    if (HOST_CHARS.containsAll(host)) {
      chars.addAll(host);
    } else {
      KJ_FAIL_REQUIRE("invalid hostname when stringifying URL", host) {
        chars.addAll("invalid-host"_kj);
        break;
      }
    }
  }

  for (auto& pathPart: path) {
    // Protect against path injection.
    KJ_REQUIRE((pathPart != "" || options.allowEmpty) && pathPart != "." && pathPart != "..",
               "invalid name in URL path", path) {
      continue;
    }
    chars.add('/');
    chars.addAll(options.percentDecode ? encodeUriPath(pathPart) : kj::str(pathPart));
  }
  if (hasTrailingSlash || (path.size() == 0 && context == HTTP_REQUEST)) {
    chars.add('/');
  }

  bool first = true;
  for (auto& param: query) {
    chars.add(first ? '?' : '&');
    first = false;
    chars.addAll(options.percentDecode ? encodeWwwForm(param.name) : kj::str(param.name));
    if (param.value.begin() != nullptr) {
      chars.add('=');
      chars.addAll(options.percentDecode ? encodeWwwForm(param.value) : kj::str(param.value));
    }
  }

  if (context == REMOTE_HREF) {
    KJ_IF_SOME(f, fragment) {
      chars.add('#');
      chars.addAll(options.percentDecode ? encodeUriFragment(f) : kj::str(f));
    }
  }

  chars.add('\0');
  return String(chars.releaseAsArray());
}